

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::useNameFilter(QFileDialogPrivate *this,int index)

{
  Data *pDVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  int iVar5;
  QAbstractItemModel *pQVar6;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  QFileInfo local_100 [8];
  QArrayData *local_f8;
  undefined1 *puStack_f0;
  QString *pQStack_e8;
  QString local_d8;
  QArrayData *local_b8;
  char16_t *pcStack_b0;
  long *local_a8;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QString> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialogOptions::nameFilters();
  puVar7 = (undefined1 *)(long)index;
  if ((undefined1 *)local_78.size == puVar7) {
    pQVar6 = QComboBox::model(((this->qFileDialogUi).d)->fileTypeCombo);
    local_d8.d.d = (Data *)0xffffffffffffffff;
    local_d8.d.ptr = (char16_t *)0x0;
    local_d8.d.size = 0;
    iVar5 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6);
    local_f8 = (QArrayData *)0xffffffffffffffff;
    puStack_f0 = (undefined1 *)0x0;
    pQStack_e8 = (QString *)0x0;
    (**(code **)(*(long *)pQVar6 + 0x60))(&local_b8,pQVar6,iVar5 + -1,0);
    if (local_a8 == (long *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
    }
    else {
      (**(code **)(*local_a8 + 0x90))(&local_58,local_a8,&local_b8,0);
    }
    ::QVariant::toString();
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_78,local_78.size,(QString *)&local_98);
    QList<QString>::end((QList<QString> *)&local_78);
    if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileDialogOptions::setNameFilters((QList_conflict *)(this->options).value.ptr);
  }
  local_58.shared = (PrivateShared *)local_78.ptr[(long)puVar7].d.d;
  local_58._8_8_ = local_78.ptr[(long)puVar7].d.ptr;
  local_58._16_8_ = local_78.ptr[(long)puVar7].d.size;
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_58.shared)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_58.shared)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QPlatformFileDialogHelper::cleanFilterList((QString *)&local_98);
  iVar5 = QFileDialogOptions::acceptMode();
  if (iVar5 == 1) {
    local_b8 = (QArrayData *)0x0;
    pcStack_b0 = (char16_t *)0x0;
    local_a8 = (long *)0x0;
    if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
      QFileInfo::QFileInfo((QFileInfo *)&local_f8,(QString *)local_98.ptr);
      QFileInfo::suffix();
      pcVar4 = pcStack_b0;
      pQVar3 = local_b8;
      qVar2 = local_d8.d.size;
      pDVar1 = local_d8.d.d;
      local_d8.d.d = (Data *)local_b8;
      local_b8 = &pDVar1->super_QArrayData;
      pcStack_b0 = local_d8.d.ptr;
      local_d8.d.ptr = pcVar4;
      local_d8.d.size = (qsizetype)local_a8;
      local_a8 = (long *)qVar2;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_f8);
    }
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QLineEdit::text(&local_d8,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
    pQStack_e8 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(local_100,(QString *)&local_d8);
    QFileInfo::suffix();
    QFileInfo::~QFileInfo(local_100);
    if ((pQStack_e8 != (QString *)0x0) && (local_a8 != (long *)0x0)) {
      QString::replace((longlong)&local_d8,local_d8.d.size - (long)pQStack_e8,pQStack_e8);
      QAbstractItemView::clearSelection((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
      QLineEdit::setText(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,&local_d8);
    }
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f8,2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
  }
  QFileSystemModel::setNameFilters((QList_conflict *)this->model);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::useNameFilter(int index)
{
    QStringList nameFilters = options->nameFilters();
    if (index == nameFilters.size()) {
        QAbstractItemModel *comboModel = qFileDialogUi->fileTypeCombo->model();
        nameFilters.append(comboModel->index(comboModel->rowCount() - 1, 0).data().toString());
        options->setNameFilters(nameFilters);
    }

    QString nameFilter = nameFilters.at(index);
    QStringList newNameFilters = QPlatformFileDialogHelper::cleanFilterList(nameFilter);
    if (q_func()->acceptMode() == QFileDialog::AcceptSave) {
        QString newNameFilterExtension;
        if (newNameFilters.size() > 0)
            newNameFilterExtension = QFileInfo(newNameFilters.at(0)).suffix();

        QString fileName = lineEdit()->text();
        const QString fileNameExtension = QFileInfo(fileName).suffix();
        if (!fileNameExtension.isEmpty() && !newNameFilterExtension.isEmpty()) {
            const qsizetype fileNameExtensionLength = fileNameExtension.size();
            fileName.replace(fileName.size() - fileNameExtensionLength,
                             fileNameExtensionLength, newNameFilterExtension);
            qFileDialogUi->listView->clearSelection();
            lineEdit()->setText(fileName);
        }
    }

    model->setNameFilters(newNameFilters);
}